

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O2

path * getFullPathName(path *__return_storage_ptr__,path *path)

{
  bool bVar1;
  path *this;
  path pStack_78;
  path local_58;
  path local_38;
  
  this = &pStack_78;
  if (Global.relativeInclude) {
    bVar1 = ghc::filesystem::path::is_absolute(path);
    if (!bVar1) {
      ghc::filesystem::path::parent_path
                (&local_38,
                 &Global.fileList._entries.
                  super__Vector_base<FileList::Entry,_std::allocator<FileList::Entry>_>._M_impl.
                  super__Vector_impl_data._M_start[Global.FileInfo.FileNum]._path);
      ghc::filesystem::operator/(&local_58,&local_38,path);
      ghc::filesystem::absolute(&pStack_78,&local_58);
      ghc::filesystem::path::lexically_normal(__return_storage_ptr__,&pStack_78);
      ghc::filesystem::path::~path(&pStack_78);
      ghc::filesystem::path::~path(&local_58);
      this = &local_38;
      goto LAB_00127afc;
    }
  }
  ghc::filesystem::absolute(&pStack_78,path);
  ghc::filesystem::path::lexically_normal(__return_storage_ptr__,&pStack_78);
LAB_00127afc:
  ghc::filesystem::path::~path(this);
  return __return_storage_ptr__;
}

Assistant:

fs::path getFullPathName(const fs::path& path)
{
	if (Global.relativeInclude && !path.is_absolute())
	{
		const fs::path &source = Global.fileList.path(Global.FileInfo.FileNum);
		return fs::absolute(source.parent_path() / path).lexically_normal();
	}
	else
	{
		return fs::absolute(path).lexically_normal();
	}
}